

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O2

UBool icu_63::UCharsTrie::findUniqueValue(UChar *pos,UBool haveUniqueValue,int32_t *uniqueValue)

{
  char16_t *pcVar1;
  int iVar2;
  UChar *pUVar3;
  UChar *pos_00;
  uint leadUnit;
  
  leadUnit = (uint)(ushort)*pos;
  pos_00 = pos + 1;
  while( true ) {
    while( true ) {
      while (leadUnit < 0x30) {
        if (leadUnit == 0) {
          leadUnit = (uint)(ushort)*pos_00;
          pos_00 = pos_00 + 1;
        }
        pUVar3 = findUniqueValueFromBranch(pos_00,leadUnit + 1,haveUniqueValue,uniqueValue);
        if (pUVar3 == (UChar *)0x0) {
          return '\0';
        }
        pos_00 = pUVar3 + 1;
        haveUniqueValue = '\x01';
        leadUnit = (uint)(ushort)*pUVar3;
      }
      if (0x3f < leadUnit) break;
      pcVar1 = pos_00 + (leadUnit - 0x2f);
      pos_00 = pcVar1 + 1;
      leadUnit = (uint)(ushort)*pcVar1;
    }
    if (leadUnit < 0x8000) {
      iVar2 = readNodeValue(pos_00,leadUnit);
    }
    else {
      iVar2 = readValue(pos_00,leadUnit & 0x7fff);
    }
    if (haveUniqueValue == '\0') {
      *uniqueValue = iVar2;
      haveUniqueValue = '\x01';
    }
    else if (iVar2 != *uniqueValue) {
      return '\0';
    }
    if (0x7fff < leadUnit) break;
    if (0x403f < leadUnit) {
      if (leadUnit < 0x7fc0) {
        pos_00 = pos_00 + 1;
      }
      else {
        pos_00 = pos_00 + 2;
      }
    }
    leadUnit = leadUnit & 0x3f;
  }
  return '\x01';
}

Assistant:

UBool
UCharsTrie::findUniqueValue(const UChar *pos, UBool haveUniqueValue, int32_t &uniqueValue) {
    int32_t node=*pos++;
    for(;;) {
        if(node<kMinLinearMatch) {
            if(node==0) {
                node=*pos++;
            }
            pos=findUniqueValueFromBranch(pos, node+1, haveUniqueValue, uniqueValue);
            if(pos==NULL) {
                return FALSE;
            }
            haveUniqueValue=TRUE;
            node=*pos++;
        } else if(node<kMinValueLead) {
            // linear-match node
            pos+=node-kMinLinearMatch+1;  // Ignore the match units.
            node=*pos++;
        } else {
            UBool isFinal=(UBool)(node>>15);
            int32_t value;
            if(isFinal) {
                value=readValue(pos, node&0x7fff);
            } else {
                value=readNodeValue(pos, node);
            }
            if(haveUniqueValue) {
                if(value!=uniqueValue) {
                    return FALSE;
                }
            } else {
                uniqueValue=value;
                haveUniqueValue=TRUE;
            }
            if(isFinal) {
                return TRUE;
            }
            pos=skipNodeValue(pos, node);
            node&=kNodeTypeMask;
        }
    }
}